

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

void prvTidyWriteChar(uint c,StreamOut *out)

{
  Bool BVar1;
  TidyPutByteFunc UNRECOVERED_JUMPTABLE_00;
  uint *puVar2;
  uint uVar3;
  byte bVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  uint theChars [2];
  int count;
  uint local_2c;
  tchar local_28;
  int local_24;
  
  if (c == 10) {
    if (out->nl == 2) {
      c = 0xd;
    }
    else {
      c = 10;
      if (out->nl == 1) {
        prvTidyWriteChar(0xd,out);
      }
    }
  }
  switch(out->encoding) {
  case 2:
    if ((int)c < 0x178) {
      if ((int)c < 0x160) {
        if (c == 0x152) {
          c = 0xbc;
        }
        else if (c == 0x153) {
          c = 0xbd;
        }
      }
      else if (c == 0x160) {
        c = 0xa6;
      }
      else if (c == 0x161) {
        c = 0xa8;
      }
    }
    else if ((int)c < 0x17e) {
      if (c == 0x178) {
        c = 0xbe;
      }
      else if (c == 0x17d) {
        c = 0xb4;
      }
    }
    else if (c == 0x17e) {
      c = 0xb8;
    }
    else if (c == 0x20ac) {
      c = 0xa4;
    }
    break;
  case 4:
    local_24 = 0;
    prvTidyEncodeCharToUTF8Bytes(c,(tmbstr)0x0,&out->sink,&local_24);
    if (0 < local_24) {
      return;
    }
    (*(out->sink).putByte)((out->sink).sinkData,0xef);
    (*(out->sink).putByte)((out->sink).sinkData,0xbf);
    (*(out->sink).putByte)((out->sink).sinkData,0xbf);
    return;
  case 5:
    if (c == 0x1b) {
      out->state = FSM_ESC;
      c = 0x1b;
    }
    else {
      switch(out->state) {
      case FSM_ESC:
        if (c == 0x28) {
          out->state = FSM_ESCP;
LAB_0015189e:
          c = 0x28;
        }
        else {
          if (c != 0x24) goto switchD_001517ad_caseD_4;
          out->state = FSM_ESCD;
          c = 0x24;
        }
        break;
      case FSM_ESCD:
        if (c == 0x28) {
          out->state = FSM_ESCDP;
          goto LAB_0015189e;
        }
      case FSM_ESCDP:
        out->state = FSM_NONASCII;
        break;
      case FSM_ESCP:
switchD_001517ad_caseD_4:
        out->state = FSM_ASCII;
        break;
      case FSM_NONASCII:
        c = c & 0x7f;
      }
    }
    break;
  case 6:
    if (0x7f < c) {
      lVar6 = 0x80;
      puVar2 = Mac2Unicode;
      while (*puVar2 != c) {
        puVar2 = puVar2 + 1;
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) {
          return;
        }
      }
LAB_00151749:
      pvVar5 = (out->sink).sinkData;
      UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
      bVar4 = -(char)lVar6;
LAB_001517e4:
      (*UNRECOVERED_JUMPTABLE_00)(pvVar5,bVar4);
      return;
    }
    break;
  case 7:
    if (0x5f < c - 0xa0 && 0x7f < c) {
      bVar4 = 0x80;
      lVar6 = 0;
      while (*(uint *)((long)Win2Unicode + lVar6) != c) {
        bVar4 = bVar4 + '\x01';
        lVar6 = lVar6 + 4;
        if (lVar6 == 0x80) {
          return;
        }
      }
      pvVar5 = (out->sink).sinkData;
      UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
      goto LAB_001517e4;
    }
    break;
  case 8:
    if (0x7f < c) {
      lVar6 = 0x80;
      puVar2 = IBM2Unicode;
      while (*puVar2 != c) {
        puVar2 = puVar2 + 1;
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) {
          return;
        }
      }
      goto LAB_00151749;
    }
    break;
  case 9:
  case 10:
  case 0xb:
    BVar1 = prvTidyIsValidUTF16FromUCS4(c);
    if (BVar1 != no) {
      BVar1 = prvTidyIsCombinedChar(c);
      if (BVar1 == no) {
        local_2c = c;
        lVar6 = 1;
      }
      else {
        BVar1 = prvTidySplitSurrogatePair(c,&local_2c,&local_28);
        lVar6 = 2;
        if (BVar1 == no) {
          return;
        }
      }
      lVar7 = 0;
      do {
        uVar3 = (&local_2c)[lVar7];
        if (out->encoding - 10U < 2) {
          (*(out->sink).putByte)((out->sink).sinkData,(byte)(uVar3 >> 8));
LAB_00151728:
          (*(out->sink).putByte)((out->sink).sinkData,(byte)uVar3);
        }
        else if (out->encoding == 9) {
          (*(out->sink).putByte)((out->sink).sinkData,(byte)uVar3);
          uVar3 = uVar3 >> 8;
          goto LAB_00151728;
        }
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
    return;
  case 0xc:
  case 0xd:
    if (0x7f < c) {
      (*(out->sink).putByte)((out->sink).sinkData,(byte)(c >> 8));
      pvVar5 = (out->sink).sinkData;
      UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
      goto LAB_00151681;
    }
  }
  pvVar5 = (out->sink).sinkData;
  UNRECOVERED_JUMPTABLE_00 = (out->sink).putByte;
LAB_00151681:
  (*UNRECOVERED_JUMPTABLE_00)(pvVar5,(byte)c);
  return;
}

Assistant:

void TY_(WriteChar)( uint c, StreamOut* out )
{
    /* Translate outgoing newlines */
    if ( LF == c )
    {
      if ( out->nl == TidyCRLF )
          TY_(WriteChar)( CR, out );
      else if ( out->nl == TidyCR )
          c = CR;
    }

    if (out->encoding == MACROMAN)
    {
        EncodeMacRoman( c, out );
    }
    else if (out->encoding == WIN1252)
    {
        EncodeWin1252( c, out );
    }
    else if (out->encoding == IBM858)
    {
        EncodeIbm858( c, out );
    }
    else if (out->encoding == LATIN0)
    {
        EncodeLatin0( c, out );
    }

    else if (out->encoding == UTF8)
    {
        int count = 0;
        
        TY_(EncodeCharToUTF8Bytes)( c, NULL, &out->sink, &count );
        if (count <= 0)
        {
            /* replacement char 0xFFFD encoded as UTF-8 */
            PutByte(0xEF, out); PutByte(0xBF, out); PutByte(0xBF, out);
        }
    }
#ifndef NO_NATIVE_ISO2022_SUPPORT
    else if (out->encoding == ISO2022)
    {
        if (c == 0x1b)  /* ESC */
            out->state = FSM_ESC;
        else
        {
            switch (out->state)
            {
            case FSM_ESC:
                if (c == '$')
                    out->state = FSM_ESCD;
                else if (c == '(')
                    out->state = FSM_ESCP;
                else
                    out->state = FSM_ASCII;
                break;

            case FSM_ESCD:
                if (c == '(')
                    out->state = FSM_ESCDP;
                else
                    out->state = FSM_NONASCII;
                break;

            case FSM_ESCDP:
                out->state = FSM_NONASCII;
                break;

            case FSM_ESCP:
                out->state = FSM_ASCII;
                break;

            case FSM_NONASCII:
                c &= 0x7F;
                break;

            case FSM_ASCII:
                break;
            }
        }

        PutByte(c, out);
    }
#endif /* NO_NATIVE_ISO2022_SUPPORT */

    else if ( out->encoding == UTF16LE ||
              out->encoding == UTF16BE ||
              out->encoding == UTF16 )
    {
        int i, numChars = 1;
        uint theChars[2];
        
        if ( !TY_(IsValidUTF16FromUCS4)(c) )
        {
            /* invalid UTF-16 value */
            numChars = 0;
        }
        else if ( TY_(IsCombinedChar)(c) )
        {
            /* output both, unless something goes wrong */
            numChars = 2;
            if ( !TY_(SplitSurrogatePair)(c, &theChars[0], &theChars[1]) )
            {
                numChars = 0;
            }
        }
        else
        {
            /* just put the char out */
            theChars[0] = c;
        }
        
        for (i = 0; i < numChars; i++)
        {
            c = theChars[i];
            
            if (out->encoding == UTF16LE)
            {
                uint ch = c & 0xFF; PutByte(ch, out); 
                ch = (c >> 8) & 0xFF; PutByte(ch, out); 
            }
    
            else if (out->encoding == UTF16BE || out->encoding == UTF16)
            {
                uint ch = (c >> 8) & 0xFF; PutByte(ch, out); 
                ch = c & 0xFF; PutByte(ch, out); 
            }
        }
    }
    else if (out->encoding == BIG5 || out->encoding == SHIFTJIS)
    {
        if (c < 128)
            PutByte(c, out);
        else
        {
            uint ch = (c >> 8) & 0xFF; PutByte(ch, out); 
            ch = c & 0xFF; PutByte(ch, out); 
        }
    }
    else
        PutByte( c, out );
}